

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkHeader.cpp
# Opt level: O3

void __thiscall ShellLinkHeader::parseFileAttributesFlags(ShellLinkHeader *this,uint flags)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  
  if (flags == 0) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffset_abi_cxx11_._M_string_length);
    pcVar3 = "NONE";
    lVar2 = 4;
  }
  else {
    if ((flags & 1) != 0) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffset_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"FILE_ATTRIBUTE_READONLY",0x17);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"The file or directory is read-only. For a file, if this bit is set, ",0x44)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"applications can read the file but cannot write to it or delete it. ",0x44)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,
                 "For a directory, if this bit is set, applications cannot delete the directory.",
                 0x4e);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    if ((flags & 2) != 0) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffset_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"FILE_ATTRIBUTE_HIDDEN",0x15);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"The file or directory is hidden. ",0x21);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,
                 "If this bit is set, the file or folder is not included in an ordinary directory listing."
                 ,0x58);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    if ((flags & 4) != 0) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffset_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"ILE_ATTRIBUTE_SYSTEM",0x14);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,
                 "The file or directory is part of the operating system or is used exclusively by the operating system."
                 ,0x65);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    if ((flags & 8) != 0) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffset_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"RESERVED1",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"A bit that MUST be zero.",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    if ((flags & 0x10) != 0) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffset_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"FILE_ATTRIBUTE_DIRECTORY",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"The link target is a directory instead of a file.",0x31);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    if ((flags & 0x20) != 0) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffset_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"FILE_ATTRIBUTE_ARCHIVE",0x16);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"The file or directory is an archive file. ",0x2a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"Applications use this flag to mark files for backup or removal.",0x3f);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    if ((flags & 0x40) != 0) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffset_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"RESERVED2",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"A bit that MUST be zero.",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    if ((char)flags < '\0') {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffset_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"FILE_ATTRIBUTE_NORMAL",0x15);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"The file or directory has no other flags set. ",0x2e);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"If this bit is 1, all other bits in this structure MUST be clear.",0x41);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    if ((flags >> 8 & 1) != 0) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffset_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," FILE_ATTRIBUTE_TEMPORARY",0x19);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"The file is being used for temporary storage.",0x2d);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    if ((flags >> 9 & 1) != 0) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffset_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"FILE_ATTRIBUTE_SPARSE_FILE",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"The file is a sparse file.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    if ((flags >> 10 & 1) != 0) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffset_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"FILE_ATTRIBUTE_REPARSE_POINT",0x1c)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"The file or directory has an associated reparse point.",0x36);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    if ((flags >> 0xb & 1) != 0) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffset_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"FILE_ATTRIBUTE_COMPRESSED",0x19);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,
                 "The file or directory is compressed. For a file, this means that all data in the file is compressed. "
                 ,0x65);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,
                 "For a directory, this means that compression is the default for newly created files and subdirectories."
                 ,0x67);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    if ((flags >> 0xc & 1) != 0) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffset_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"FILE_ATTRIBUTE_OFFLINE",0x16);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"The data of the file is not immediately available.",0x32);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    if ((flags >> 0xd & 1) != 0) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffset_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"FILE_ATTRIBUTE_NOT_CONTENT_INDEXED",0x22);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      poVar1 = (ostream *)std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"The contents of the file need to be indexed.",0x2c);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    if ((flags >> 0xe & 1) == 0) {
      return;
    }
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffset_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"FILE_ATTRIBUTE_ENCRYPTED",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    poVar1 = (ostream *)std::ostream::flush();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "The file or directory is encrypted. For a file, this means that all data in the file is encrypted. "
               ,99);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    poVar1 = (ostream *)std::ostream::flush();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    pcVar3 = 
    "For a directory, this means that encryption is the default for newly created files and subdirectories."
    ;
    lVar2 = 0x66;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void ShellLinkHeader::parseFileAttributesFlags(unsigned int flags) {
        if (flags == 0x00000000)
            cout << Utils::defaultOffset << "NONE" << endl;
        if (flags & FILE_ATTRIBUTE_READONLY) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_READONLY" << endl <<
                 Utils::defaultOffsetDocInfo << "The file or directory is read-only. For a file, if this bit is set, " << endl <<
                 Utils::defaultOffsetDocInfo << "applications can read the file but cannot write to it or delete it. " << endl <<
                 Utils::defaultOffsetDocInfo << "For a directory, if this bit is set, applications cannot delete the directory." << endl;
        }
        if (flags & FILE_ATTRIBUTE_HIDDEN) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_HIDDEN" << endl <<
                 Utils::defaultOffsetDocInfo << "The file or directory is hidden. " << endl <<
                 Utils::defaultOffsetDocInfo << "If this bit is set, the file or folder is not included in an ordinary directory listing." << endl;
        }
        if (flags & FILE_ATTRIBUTE_SYSTEM) {
            cout << Utils::defaultOffset << "ILE_ATTRIBUTE_SYSTEM" << endl <<
                 Utils::defaultOffsetDocInfo << "The file or directory is part of the operating system or is used exclusively by the operating system." << endl;
        }
        if (flags & RESERVED1) {
            cout << Utils::defaultOffset << "RESERVED1" << endl <<
                 Utils::defaultOffsetDocInfo << "A bit that MUST be zero." << endl;
        }
        if (flags & FILE_ATTRIBUTE_DIRECTORY) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_DIRECTORY" << endl <<
                 Utils::defaultOffsetDocInfo << "The link target is a directory instead of a file." << endl;
        }
        if (flags & FILE_ATTRIBUTE_ARCHIVE) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_ARCHIVE" << endl <<
                 Utils::defaultOffsetDocInfo << "The file or directory is an archive file. " << endl <<
                 Utils::defaultOffsetDocInfo << "Applications use this flag to mark files for backup or removal." << endl;
        }
        if (flags & RESERVED2) {
            cout << Utils::defaultOffset << "RESERVED2" << endl <<
                 Utils::defaultOffsetDocInfo << "A bit that MUST be zero." << endl;
        }
        if (flags & FILE_ATTRIBUTE_NORMAL) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_NORMAL" << endl <<
                 Utils::defaultOffsetDocInfo << "The file or directory has no other flags set. " << endl <<
                 Utils::defaultOffsetDocInfo << "If this bit is 1, all other bits in this structure MUST be clear." << endl;
        }
        if (flags & FILE_ATTRIBUTE_TEMPORARY) {
            cout << Utils::defaultOffset << " FILE_ATTRIBUTE_TEMPORARY" << endl <<
                 Utils::defaultOffsetDocInfo << "The file is being used for temporary storage." << endl;
        }
        if (flags & FILE_ATTRIBUTE_SPARSE_FILE) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_SPARSE_FILE" << endl <<
                 Utils::defaultOffsetDocInfo << "The file is a sparse file." << endl;
        }
        if (flags & FILE_ATTRIBUTE_REPARSE_POINT) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_REPARSE_POINT" << endl <<
                 Utils::defaultOffsetDocInfo << "The file or directory has an associated reparse point." << endl;
        }
        if (flags & FILE_ATTRIBUTE_COMPRESSED) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_COMPRESSED" << endl <<
                 Utils::defaultOffsetDocInfo << "The file or directory is compressed. For a file, this means that all data in the file is compressed. " << endl <<
                 Utils::defaultOffsetDocInfo << "For a directory, this means that compression is the default for newly created files and subdirectories." << endl;
        }
        if (flags & FILE_ATTRIBUTE_OFFLINE) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_OFFLINE" << endl <<
                 Utils::defaultOffsetDocInfo << "The data of the file is not immediately available." << endl;
        }
        if (flags & FILE_ATTRIBUTE_NOT_CONTENT_INDEXED) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_NOT_CONTENT_INDEXED" << endl <<
                 Utils::defaultOffsetDocInfo << "The contents of the file need to be indexed." << endl;
        }
        if (flags & FILE_ATTRIBUTE_ENCRYPTED) {
            cout << Utils::defaultOffset << "FILE_ATTRIBUTE_ENCRYPTED" << endl <<
                 Utils::defaultOffsetDocInfo << "The file or directory is encrypted. For a file, this means that all data in the file is encrypted. " << endl <<
                 Utils::defaultOffsetDocInfo << "For a directory, this means that encryption is the default for newly created files and subdirectories." << endl;
        }
    }